

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D.c
# Opt level: O2

int Jac(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix J,void *user_data,N_Vector tmp1,N_Vector tmp2
       ,N_Vector tmp3)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  int iVar12;
  long lVar13;
  void *flagvalue;
  long lVar14;
  
  SUNMatZero(J);
  lVar7 = *user_data;
  dVar3 = *(double *)((long)user_data + 8);
  lVar14 = 0x40;
  for (lVar13 = 1; lVar13 < lVar7 + -1; lVar13 = lVar13 + 1) {
    lVar8 = *(long *)((long)J->content + 0x28);
    lVar9 = *(long *)((long)J->content + 0x40);
    lVar10 = *(long *)(lVar9 + -0x40 + lVar14);
    *(double *)(lVar10 + 0x18 + lVar8 * 8) =
         (*(double *)((long)user_data + 0x20) / dVar3) / dVar3 +
         *(double *)(lVar10 + 0x18 + lVar8 * 8);
    lVar10 = *(long *)(lVar9 + -0x38 + lVar14);
    *(double *)(lVar10 + 0x18 + lVar8 * 8) =
         (*(double *)((long)user_data + 0x28) / dVar3) / dVar3 +
         *(double *)(lVar10 + 0x18 + lVar8 * 8);
    lVar10 = *(long *)(lVar9 + -0x30 + lVar14);
    *(double *)(lVar10 + 0x18 + lVar8 * 8) =
         (*(double *)((long)user_data + 0x30) / dVar3) / dVar3 +
         *(double *)(lVar10 + 0x18 + lVar8 * 8);
    lVar10 = *(long *)(lVar9 + -0x28 + lVar14);
    *(double *)(lVar10 + lVar8 * 8) =
         *(double *)(lVar10 + lVar8 * 8) -
         ((*(double *)((long)user_data + 0x20) + *(double *)((long)user_data + 0x20)) / dVar3) /
         dVar3;
    lVar10 = *(long *)(lVar9 + -0x20 + lVar14);
    *(double *)(lVar10 + lVar8 * 8) =
         *(double *)(lVar10 + lVar8 * 8) -
         ((*(double *)((long)user_data + 0x28) + *(double *)((long)user_data + 0x28)) / dVar3) /
         dVar3;
    lVar10 = *(long *)(lVar9 + -0x18 + lVar14);
    *(double *)(lVar10 + lVar8 * 8) =
         *(double *)(lVar10 + lVar8 * 8) -
         ((*(double *)((long)user_data + 0x30) + *(double *)((long)user_data + 0x30)) / dVar3) /
         dVar3;
    lVar10 = *(long *)(lVar9 + -0x10 + lVar14);
    *(double *)(lVar10 + -0x18 + lVar8 * 8) =
         (*(double *)((long)user_data + 0x20) / dVar3) / dVar3 +
         *(double *)(lVar10 + -0x18 + lVar8 * 8);
    lVar10 = *(long *)(lVar9 + -8 + lVar14);
    *(double *)(lVar10 + -0x18 + lVar8 * 8) =
         (*(double *)((long)user_data + 0x28) / dVar3) / dVar3 +
         *(double *)(lVar10 + -0x18 + lVar8 * 8);
    *(double *)(*(long *)(lVar9 + lVar14) + -0x18 + lVar8 * 8) =
         (*(double *)((long)user_data + 0x30) / dVar3) / dVar3 +
         *(double *)(*(long *)(lVar9 + lVar14) + -0x18 + lVar8 * 8);
    lVar14 = lVar14 + 0x18;
  }
  dVar3 = *(double *)((long)user_data + 0x38);
  flagvalue = (void *)N_VGetArrayPointer(y);
  iVar12 = check_flag(flagvalue,"N_VGetArrayPointer",0);
  if (iVar12 == 0) {
    lVar14 = 0x28;
    for (lVar13 = 1; lVar13 < lVar7 + -1; lVar13 = lVar13 + 1) {
      dVar4 = *(double *)((long)flagvalue + lVar14 + -0x10);
      dVar5 = *(double *)((long)flagvalue + lVar14);
      lVar8 = *(long *)((long)J->content + 0x28);
      lVar9 = *(long *)((long)J->content + 0x40);
      lVar10 = *(long *)(lVar9 + -0x10 + lVar14);
      dVar6 = *(double *)((long)flagvalue + lVar14 + -8);
      pdVar1 = (double *)(lVar10 + lVar8 * 8);
      dVar11 = pdVar1[1];
      pdVar2 = (double *)(lVar10 + lVar8 * 8);
      *pdVar2 = *pdVar1 + -(dVar5 + 1.0) + dVar6 * (dVar4 + dVar4);
      pdVar2[1] = dVar11 + dVar5 + dVar6 * -(dVar4 + dVar4);
      *(double *)(lVar10 + 0x10 + lVar8 * 8) = *(double *)(lVar10 + 0x10 + lVar8 * 8) - dVar5;
      lVar10 = *(long *)(lVar9 + -8 + lVar14);
      *(double *)(lVar10 + -8 + lVar8 * 8) = *(double *)(lVar10 + -8 + lVar8 * 8) + dVar4 * dVar4;
      *(double *)(lVar10 + lVar8 * 8) = *(double *)(lVar10 + lVar8 * 8) - dVar4 * dVar4;
      lVar9 = *(long *)(lVar9 + lVar14);
      *(double *)(lVar9 + -0x10 + lVar8 * 8) = *(double *)(lVar9 + -0x10 + lVar8 * 8) - dVar4;
      pdVar1 = (double *)(lVar9 + -8 + lVar8 * 8);
      dVar5 = pdVar1[1];
      pdVar2 = (double *)(lVar9 + -8 + lVar8 * 8);
      *pdVar2 = dVar4 + *pdVar1;
      pdVar2[1] = (-1.0 / dVar3 - dVar4) + dVar5;
      lVar14 = lVar14 + 0x18;
    }
  }
  return 0;
}

Assistant:

static int Jac(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix J,
               void* user_data, N_Vector tmp1, N_Vector tmp2, N_Vector tmp3)
{
  UserData udata = (UserData)user_data; /* access problem data */
  SUNMatZero(J);                        /* Initialize Jacobian to zero */

  /* Fill in the Laplace matrix */
  LaplaceMatrix(SUN_RCONST(1.0), J, udata);

  /* Add in the Jacobian of the reaction terms matrix */
  ReactionJac(SUN_RCONST(1.0), y, J, udata);

  return 0; /* Return with success */
}